

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator,uint32_t bits,uint32_t truncPoly)

{
  uint uVar1;
  uint uVar2;
  uint32_t value;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  p_crc_calculator->remainder = 0;
  p_crc_calculator->bits = bits;
  p_crc_calculator->trunc_poly = truncPoly;
  p_crc_calculator->final_result_mask = ~(-1 << ((byte)bits & 0x1f));
  uVar2 = 1 << ((byte)bits - 1 & 0x1f);
  lVar3 = 0;
  do {
    uVar5 = 0;
    uVar4 = 0x80;
    do {
      uVar6 = uVar4 & (uint)lVar3;
      if (uVar6 != 0) {
        uVar6 = uVar2;
      }
      uVar6 = uVar6 ^ uVar5;
      uVar1 = uVar6 * 2;
      uVar5 = uVar1 ^ truncPoly;
      if ((uVar6 & uVar2) == 0) {
        uVar5 = uVar1;
      }
      bVar7 = 1 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar7);
    p_crc_calculator->table[lVar3] = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

void av1_crc_calculator_init(CRC_CALCULATOR *p_crc_calculator, uint32_t bits,
                             uint32_t truncPoly) {
  p_crc_calculator->remainder = 0;
  p_crc_calculator->bits = bits;
  p_crc_calculator->trunc_poly = truncPoly;
  p_crc_calculator->final_result_mask = (1 << bits) - 1;
  crc_calculator_init_table(p_crc_calculator);
}